

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::http_parser::parse_chunk_header
          (http_parser *this,span<const_char> buf,int64_t *chunk_size,int *header_size)

{
  char *pcVar1;
  _Rb_tree_header *p_Var2;
  _Alloc_hider _Var3;
  size_type sVar4;
  char cVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  _Base_ptr p_Var9;
  char *__last;
  ulong uVar10;
  size_type sVar11;
  char *pcVar12;
  long lVar13;
  bool bVar14;
  string line;
  string name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tail_headers;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string value;
  
  pcVar12 = buf.m_ptr;
  pcVar1 = pcVar12 + buf.m_len;
  if (0 < buf.m_len) {
    pcVar12 = pcVar12 + (*pcVar12 == '\r');
  }
  if (pcVar12 < pcVar1) {
    pcVar12 = pcVar12 + (*pcVar12 == '\n');
  }
  if (pcVar12 != pcVar1) {
    local_90.first._M_dataplus._M_p._0_1_ = 10;
    pcVar7 = ::std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (pcVar12,pcVar1);
    if (pcVar7 != pcVar1) {
      pcVar7 = pcVar7 + 1;
      *header_size = (int)pcVar7 - (int)buf.m_ptr;
      lVar13 = 0;
      for (; pcVar12 != pcVar7; pcVar12 = pcVar12 + 1) {
        cVar5 = *pcVar12;
        if ((cVar5 != '\n') && (cVar5 != '\r')) {
          if (cVar5 == ';') break;
          uVar6 = hex_to_int(cVar5);
          if (((int)uVar6 < 0) || (0x7fffffffffffffe < lVar13)) {
            *chunk_size = -1;
            return true;
          }
          lVar13 = lVar13 * 0x10 + (ulong)uVar6;
        }
      }
      *chunk_size = lVar13;
      if (lVar13 != 0) {
        return true;
      }
      p_Var2 = &tail_headers._M_t._M_impl.super__Rb_tree_header;
      tail_headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      tail_headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      tail_headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_90.first._M_dataplus._M_p._0_1_ = 10;
      tail_headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      tail_headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      pcVar12 = ::std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (pcVar7,pcVar1);
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      do {
        bVar14 = pcVar12 == pcVar1;
        if (bVar14) break;
        __last = pcVar12;
        if ((pcVar7 != pcVar12) && (__last = pcVar12 + -1, pcVar12[-1] != '\r')) {
          __last = pcVar12;
        }
        ::std::__cxx11::string::assign<char_const*,void>((string *)&line,pcVar7,__last);
        pcVar7 = pcVar12 + 1;
        uVar8 = ::std::__cxx11::string::find('\0',0x3a);
        if (uVar8 == 0xffffffffffffffff) {
          *header_size = (int)pcVar7 - (int)buf.m_ptr;
          for (p_Var9 = tail_headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              pcVar12 = pcVar7, (_Rb_tree_header *)p_Var9 != p_Var2;
              p_Var9 = (_Base_ptr)::std::_Rb_tree_increment(p_Var9)) {
            ::std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_insert_equal<std::pair<std::__cxx11::string_const,std::__cxx11::string>const&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&this->m_header,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(p_Var9 + 1));
          }
        }
        else {
          ::std::__cxx11::string::substr((ulong)&name,(ulong)&line);
          sVar4 = name._M_string_length;
          _Var3 = name._M_dataplus;
          for (sVar11 = 0; sVar4 != sVar11; sVar11 = sVar11 + 1) {
            cVar5 = to_lower(_Var3._M_p[sVar11]);
            _Var3._M_p[sVar11] = cVar5;
          }
          uVar10 = uVar8;
          do {
            uVar10 = uVar10 + 1;
            if (line._M_string_length <= uVar10) break;
          } while ((line._M_dataplus._M_p[uVar10] == ' ') || (line._M_dataplus._M_p[uVar10] == '\t')
                  );
          ::std::__cxx11::string::substr((ulong)&value,(ulong)&line);
          ::std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (&local_90,&name,&value);
          ::std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&tail_headers,&local_90);
          ::std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(&local_90);
          local_90.first._M_dataplus._M_p._0_1_ = 10;
          pcVar12 = ::std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                              (pcVar7,pcVar1,&local_90);
          ::std::__cxx11::string::~string((string *)&value);
          ::std::__cxx11::string::~string((string *)&name);
        }
      } while (uVar8 != 0xffffffffffffffff);
      ::std::__cxx11::string::~string((string *)&line);
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&tail_headers._M_t);
      return !bVar14;
    }
  }
  return false;
}

Assistant:

bool http_parser::parse_chunk_header(span<char const> buf
		, std::int64_t* chunk_size, int* header_size)
	{
		char const* pos = buf.data();

		// ignore one optional new-line. This is since each chunk
		// is terminated by a newline. we're likely to see one
		// before the actual header.

		if (pos < buf.end() && pos[0] == '\r') ++pos;
		if (pos < buf.end() && pos[0] == '\n') ++pos;
		if (pos == buf.end()) return false;

		TORRENT_ASSERT(pos <= buf.end());
		char const* newline = std::find(pos, buf.end(), '\n');
		if (newline == buf.end()) return false;
		++newline;

		// the chunk header is a single line, a hex length of the
		// chunk followed by an optional semi-colon with a comment
		// in case the length is 0, the stream is terminated and
		// there are extra tail headers, which is terminated by an
		// empty line

		*header_size = int(newline - buf.data());

		// first, read the chunk length
		std::int64_t size = 0;
		for (char const* i = pos; i != newline; ++i)
		{
			if (*i == '\r') continue;
			if (*i == '\n') continue;
			if (*i == ';') break;
			int const digit = aux::hex_to_int(*i);
			if (digit < 0)
			{
				*chunk_size = -1;
				return true;
			}
			if (size >= std::numeric_limits<std::int64_t>::max() / 16)
			{
				*chunk_size = -1;
				return true;
			}
			size *= 16;
			size += digit;
		}
		*chunk_size = size;

		if (*chunk_size != 0)
		{
			// the newline is at least 1 byte, and the length-prefix is at least 1
			// byte
			TORRENT_ASSERT(newline - buf.data() >= 2);
			return true;
		}

		// this is the terminator of the stream. Also read headers
		std::map<std::string, std::string> tail_headers;
		pos = newline;
		newline = std::find(pos, buf.end(), '\n');

		std::string line;
		while (newline != buf.end())
		{
			// if the LF character is preceded by a CR
			// character, don't copy it into the line string.
			char const* line_end = newline;
			if (pos != line_end && *(line_end - 1) == '\r') --line_end;
			line.assign(pos, line_end);
			++newline;
			pos = newline;

			std::string::size_type separator = line.find(':');
			if (separator == std::string::npos)
			{
				// this means we got a blank line,
				// the header is finished and the body
				// starts.
				*header_size = int(newline - buf.data());

				// the newline alone is two bytes
				TORRENT_ASSERT(newline - buf.data() > 2);

				// we were successful in parsing the headers.
				// add them to the headers in the parser
				for (auto const& p : tail_headers)
					m_header.insert(p);

				return true;
			}

			std::string name = line.substr(0, separator);
			std::transform(name.begin(), name.end(), name.begin(), &to_lower);
			++separator;
			// skip whitespace
			while (separator < line.size()
				&& (line[separator] == ' ' || line[separator] == '\t'))
				++separator;
			std::string value = line.substr(separator, std::string::npos);
			tail_headers.insert(std::make_pair(name, value));
//			std::fprintf(stderr, "tail_header: %s: %s\n", name.c_str(), value.c_str());

			newline = std::find(pos, buf.end(), '\n');
		}
		return false;
	}